

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O1

TestResult *
JsonTest::checkEqual<char_const*,std::__cxx11::string>
          (TestResult *result,char *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,char *file,
          uint line,char *expr)

{
  int iVar1;
  TestResult *pTVar2;
  bool bVar3;
  allocator local_5d;
  uint local_5c;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_5c = line;
  local_58 = expr;
  std::__cxx11::string::string((string *)&local_50,expected,&local_5d);
  bVar3 = true;
  if (local_50._M_string_length == actual->_M_string_length) {
    if (local_50._M_string_length == 0) {
      bVar3 = false;
    }
    else {
      iVar1 = bcmp(local_50._M_dataplus._M_p,(actual->_M_dataplus)._M_p,local_50._M_string_length);
      bVar3 = iVar1 != 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar3) {
    TestResult::addFailure(result,file,local_5c,local_58);
    pTVar2 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    std::__cxx11::string::string((string *)&local_50,expected,&local_5d);
    pTVar2 = TestResult::operator<<(pTVar2,&local_50);
    TestResult::operator<<(pTVar2,(char (*) [2])0x14814f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pTVar2 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar2,actual);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}